

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# landb.hpp
# Opt level: O2

bool __thiscall lan::db::get<bool>(db *this,string *context,string *name,db_bit_type type)

{
  void *pvVar1;
  db_bits *pdVar2;
  db_bit *pdVar3;
  invalid_argument *this_00;
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  std::__cxx11::string::string((string *)&local_40,(string *)context);
  pdVar2 = find_rec(this,&local_40,Container,this->first);
  this->data = pdVar2;
  std::__cxx11::string::~string((string *)&local_40);
  if (pdVar2 != (db_bits *)0x0) {
    std::__cxx11::string::string((string *)&local_a0,(string *)name);
    pdVar3 = find_any(this,&local_a0,type,this->data->lin);
    this->data = pdVar3;
    if (pdVar3 == (db_bit *)0x0) {
      std::__cxx11::string::~string((string *)&local_a0);
    }
    else {
      pvVar1 = pdVar3->data;
      std::__cxx11::string::~string((string *)&local_a0);
      if (pvVar1 != (void *)0x0) {
        return (bool)*this->data->data;
      }
    }
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string((string *)&local_80,(string *)name);
  error_string(&local_60,this,_bit_name_error,&local_80);
  std::invalid_argument::invalid_argument(this_00,(string *)&local_60);
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

any get(std::string context, std::string const name, const lan::db_bit_type type){
            if ((data = find_rec(context, lan::Container, first))) {
                if((data = find_any(name, type, data->lin)) and data->data){
                    any * data_p = (any*)data->data;
                    return ((any&)*data_p);
                }
            } throw lan::errors::bit_name_error(error_string(errors::_private::_bit_name_error, name));
        }